

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void rfft4pt(float *ioptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float scale;
  float Two;
  float w0r;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float *ioptr_local;
  
  fVar1 = *ioptr + ioptr[4];
  fVar2 = ioptr[1] + ioptr[5];
  fVar8 = *ioptr - ioptr[4];
  fVar9 = ioptr[1] - ioptr[5];
  fVar10 = ioptr[2] - ioptr[6];
  fVar11 = ioptr[3] - ioptr[7];
  fVar3 = ioptr[2] + ioptr[6];
  fVar4 = ioptr[3] + ioptr[7];
  fVar5 = fVar1 + fVar3;
  fVar6 = fVar2 + fVar4;
  fVar12 = fVar8 - fVar11;
  fVar7 = fVar9 + fVar10;
  fVar8 = fVar8 + fVar11;
  fVar9 = fVar9 - fVar10;
  fVar10 = fVar8 + fVar12;
  fVar11 = fVar9 - fVar7;
  fVar9 = fVar9 + fVar7;
  fVar12 = fVar12 - fVar8;
  fVar7 = fVar10 + fVar9 * 0.70710677 + fVar12 * 0.70710677;
  fVar8 = (fVar11 - fVar9 * 0.70710677) + fVar12 * 0.70710677;
  ioptr[4] = fVar1 - fVar3;
  ioptr[5] = fVar4 - fVar2;
  *ioptr = fVar5 + fVar6;
  ioptr[1] = fVar5 - fVar6;
  ioptr[2] = fVar7 * 0.5;
  ioptr[3] = fVar8 * 0.5;
  ioptr[6] = (fVar10 * 2.0 - fVar7) * 0.5;
  ioptr[7] = (fVar8 - fVar11 * 2.0) * 0.5;
  return;
}

Assistant:

static inline void rfft4pt(float *ioptr){
/***   RADIX 8 rfft	***/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float t0r, t0i, t1r, t1i;
float w0r = 1.0/MYROOT2; /* cos(pi/4)	*/
const float Two = 2.0;
const float scale = 0.5;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];
f1r = ioptr[4];
f1i = ioptr[5];
f2r = ioptr[2];
f2i = ioptr[3];
f3r = ioptr[6];
f3i = ioptr[7];

		/* Butterflys		*/
		/*
		f0	-	-	t0	-	-	f0
		f1	-  1 -	f1	-	-	f1
		f2	-	-	f2	-  1 -	f2
		f3	-  1 -	t1	- -i -	f3
		*/

t0r = f0r + f1r;
t0i = f0i + f1i;
f1r = f0r - f1r;
f1i = f0i - f1i;

t1r = f2r - f3r;
t1i = f2i - f3i;
f2r = f2r + f3r;
f2i = f2i + f3i;

f0r = t0r + f2r;
f0i = t0i + f2i;
f2r = t0r - f2r;
f2i = f2i - t0i;	// neg for rfft

f3r = f1r - t1i;
f3i = f1i + t1r;
f1r = f1r + t1i;
f1i = f1i - t1r;

	/* finish rfft */
t0r = 	f0r + f0i;    /* compute Re(x[0]) */
t0i = 	f0r - f0i;    /* compute Re(x[N/2]) */

t1r = f1r + f3r;
t1i = f1i - f3i;
f0r = f1i + f3i;
f0i = f3r - f1r;

f1r = t1r + w0r * f0r + w0r * f0i;
f1i = t1i - w0r * f0r + w0r * f0i;
f3r = Two * t1r - f1r;
f3i = f1i - Two * t1i;

	/* store result */
ioptr[4] = f2r;
ioptr[5] = f2i;
ioptr[0] = t0r;
ioptr[1] = t0i;

ioptr[2] = scale*f1r;
ioptr[3] = scale*f1i;
ioptr[6] = scale*f3r;
ioptr[7] = scale*f3i;
}